

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

google_protobuf_FileDescriptorProto *
google_protobuf_FileDescriptorProto_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  google_protobuf_FileDescriptorProto *msg;
  
  msg = google_protobuf_FileDescriptorProto_new(arena);
  if (msg == (google_protobuf_FileDescriptorProto *)0x0) {
    msg = (google_protobuf_FileDescriptorProto *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,&msg->base_dont_copy_me__upb_internal_use_only,
                       &google__protobuf__FileDescriptorProto_msg_init,(upb_ExtensionRegistry *)0x0,
                       0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      msg = (google_protobuf_FileDescriptorProto *)0x0;
    }
  }
  return msg;
}

Assistant:

UPB_INLINE google_protobuf_FileDescriptorProto* google_protobuf_FileDescriptorProto_parse(const char* buf, size_t size, upb_Arena* arena) {
  google_protobuf_FileDescriptorProto* ret = google_protobuf_FileDescriptorProto_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &google__protobuf__FileDescriptorProto_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}